

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column.h
# Opt level: O1

constant_type * __thiscall
winmd::reader::Constant::Value(constant_type *__return_storage_ptr__,Constant *this)

{
  table_base *ptVar1;
  database *pdVar2;
  __index_type _Var3;
  ConstantType CVar4;
  undefined1 local_38 [32];
  
  CVar4 = table_base::get_value<winmd::reader::ConstantType>
                    ((this->super_row_base<winmd::reader::Constant>).m_table,
                     (this->super_row_base<winmd::reader::Constant>).m_index,0);
  switch(CVar4) {
  case Boolean:
    ptVar1 = (this->super_row_base<winmd::reader::Constant>).m_table;
    pdVar2 = ptVar1->m_database;
    table_base::get_value<unsigned_int>
              (ptVar1,(this->super_row_base<winmd::reader::Constant>).m_index,2);
    database::get_blob((database *)local_38,(uint32_t)pdVar2);
    byte_view::check_available((byte_view *)local_38,1);
    *(char *)&(__return_storage_ptr__->
              super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
              ).
              super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              ._M_u = *(char *)local_38._0_8_;
    _Var3 = '\0';
    break;
  case Char:
    ptVar1 = (this->super_row_base<winmd::reader::Constant>).m_table;
    pdVar2 = ptVar1->m_database;
    table_base::get_value<unsigned_int>
              (ptVar1,(this->super_row_base<winmd::reader::Constant>).m_index,2);
    database::get_blob((database *)local_38,(uint32_t)pdVar2);
    byte_view::check_available((byte_view *)local_38,2);
    *(undefined2 *)
     &(__return_storage_ptr__->
      super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
      ).
      super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      ._M_u = *(undefined2 *)local_38._0_8_;
    _Var3 = '\x01';
    break;
  case Int8:
    ptVar1 = (this->super_row_base<winmd::reader::Constant>).m_table;
    pdVar2 = ptVar1->m_database;
    table_base::get_value<unsigned_int>
              (ptVar1,(this->super_row_base<winmd::reader::Constant>).m_index,2);
    database::get_blob((database *)local_38,(uint32_t)pdVar2);
    byte_view::check_available((byte_view *)local_38,1);
    *(char *)&(__return_storage_ptr__->
              super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
              ).
              super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              ._M_u = *(char *)local_38._0_8_;
    _Var3 = '\x02';
    break;
  case UInt8:
    ptVar1 = (this->super_row_base<winmd::reader::Constant>).m_table;
    pdVar2 = ptVar1->m_database;
    table_base::get_value<unsigned_int>
              (ptVar1,(this->super_row_base<winmd::reader::Constant>).m_index,2);
    database::get_blob((database *)local_38,(uint32_t)pdVar2);
    byte_view::check_available((byte_view *)local_38,1);
    *(char *)&(__return_storage_ptr__->
              super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
              ).
              super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              ._M_u = *(char *)local_38._0_8_;
    _Var3 = '\x03';
    break;
  case Int16:
    ptVar1 = (this->super_row_base<winmd::reader::Constant>).m_table;
    pdVar2 = ptVar1->m_database;
    table_base::get_value<unsigned_int>
              (ptVar1,(this->super_row_base<winmd::reader::Constant>).m_index,2);
    database::get_blob((database *)local_38,(uint32_t)pdVar2);
    byte_view::check_available((byte_view *)local_38,2);
    *(undefined2 *)
     &(__return_storage_ptr__->
      super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
      ).
      super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      ._M_u = *(undefined2 *)local_38._0_8_;
    _Var3 = '\x04';
    break;
  case UInt16:
    ptVar1 = (this->super_row_base<winmd::reader::Constant>).m_table;
    pdVar2 = ptVar1->m_database;
    table_base::get_value<unsigned_int>
              (ptVar1,(this->super_row_base<winmd::reader::Constant>).m_index,2);
    database::get_blob((database *)local_38,(uint32_t)pdVar2);
    byte_view::check_available((byte_view *)local_38,2);
    *(undefined2 *)
     &(__return_storage_ptr__->
      super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
      ).
      super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      ._M_u = *(undefined2 *)local_38._0_8_;
    _Var3 = '\x05';
    break;
  case Int32:
    ptVar1 = (this->super_row_base<winmd::reader::Constant>).m_table;
    pdVar2 = ptVar1->m_database;
    table_base::get_value<unsigned_int>
              (ptVar1,(this->super_row_base<winmd::reader::Constant>).m_index,2);
    database::get_blob((database *)local_38,(uint32_t)pdVar2);
    byte_view::check_available((byte_view *)local_38,4);
    *(undefined4 *)
     &(__return_storage_ptr__->
      super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
      ).
      super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      ._M_u = *(undefined4 *)local_38._0_8_;
    _Var3 = '\x06';
    break;
  case UInt32:
    ptVar1 = (this->super_row_base<winmd::reader::Constant>).m_table;
    pdVar2 = ptVar1->m_database;
    table_base::get_value<unsigned_int>
              (ptVar1,(this->super_row_base<winmd::reader::Constant>).m_index,2);
    database::get_blob((database *)local_38,(uint32_t)pdVar2);
    byte_view::check_available((byte_view *)local_38,4);
    *(undefined4 *)
     &(__return_storage_ptr__->
      super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
      ).
      super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      ._M_u = *(undefined4 *)local_38._0_8_;
    _Var3 = '\a';
    break;
  case Int64:
    ptVar1 = (this->super_row_base<winmd::reader::Constant>).m_table;
    pdVar2 = ptVar1->m_database;
    table_base::get_value<unsigned_int>
              (ptVar1,(this->super_row_base<winmd::reader::Constant>).m_index,2);
    database::get_blob((database *)local_38,(uint32_t)pdVar2);
    byte_view::check_available((byte_view *)local_38,8);
    *(undefined8 *)
     &(__return_storage_ptr__->
      super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
      ).
      super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      ._M_u = *(undefined8 *)local_38._0_8_;
    _Var3 = '\b';
    break;
  case UInt64:
    ptVar1 = (this->super_row_base<winmd::reader::Constant>).m_table;
    pdVar2 = ptVar1->m_database;
    table_base::get_value<unsigned_int>
              (ptVar1,(this->super_row_base<winmd::reader::Constant>).m_index,2);
    database::get_blob((database *)local_38,(uint32_t)pdVar2);
    byte_view::check_available((byte_view *)local_38,8);
    *(undefined8 *)
     &(__return_storage_ptr__->
      super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
      ).
      super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      ._M_u = *(undefined8 *)local_38._0_8_;
    _Var3 = '\t';
    break;
  case Float32:
    ptVar1 = (this->super_row_base<winmd::reader::Constant>).m_table;
    pdVar2 = ptVar1->m_database;
    table_base::get_value<unsigned_int>
              (ptVar1,(this->super_row_base<winmd::reader::Constant>).m_index,2);
    database::get_blob((database *)local_38,(uint32_t)pdVar2);
    byte_view::check_available((byte_view *)local_38,4);
    *(undefined4 *)
     &(__return_storage_ptr__->
      super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
      ).
      super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      ._M_u = *(undefined4 *)local_38._0_8_;
    _Var3 = '\n';
    break;
  case Float64:
    ptVar1 = (this->super_row_base<winmd::reader::Constant>).m_table;
    pdVar2 = ptVar1->m_database;
    table_base::get_value<unsigned_int>
              (ptVar1,(this->super_row_base<winmd::reader::Constant>).m_index,2);
    database::get_blob((database *)local_38,(uint32_t)pdVar2);
    byte_view::check_available((byte_view *)local_38,8);
    *(undefined8 *)
     &(__return_storage_ptr__->
      super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
      ).
      super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      ._M_u = *(undefined8 *)local_38._0_8_;
    _Var3 = '\v';
    break;
  case String:
    ptVar1 = (this->super_row_base<winmd::reader::Constant>).m_table;
    pdVar2 = ptVar1->m_database;
    table_base::get_value<unsigned_int>
              (ptVar1,(this->super_row_base<winmd::reader::Constant>).m_index,2);
    database::get_blob((database *)local_38,(uint32_t)pdVar2);
    *(ulong *)&(__return_storage_ptr__->
               super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
               ).
               super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               .
               super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               .
               super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               .
               super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               .
               super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               ._M_u = (ulong)((uint)(local_38._8_4_ - (int)local_38._0_8_) >> 1);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
             ).
             super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
             .
             super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
             .
             super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
             .
             super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
             .
             super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
             ._M_u + 8) = local_38._0_8_;
    _Var3 = '\f';
    break;
  default:
    local_38._0_8_ = local_38 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Invalid constant type","");
    impl::throw_invalid((string *)local_38);
  case Class:
    *(undefined8 *)
     &(__return_storage_ptr__->
      super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
      ).
      super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      ._M_u = 0;
    _Var3 = '\r';
  }
  (__return_storage_ptr__->
  super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
  ).
  super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
  .
  super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
  .
  super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
  .
  super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
  ._M_index = _Var3;
  return __return_storage_ptr__;
}

Assistant:

inline Constant::constant_type Constant::Value() const
    {
        switch (Type())
        {
        case ConstantType::Boolean:
            return ValueBoolean();
        case ConstantType::Char:
            return ValueChar();
        case ConstantType::Int8:
            return ValueInt8();
        case ConstantType::UInt8:
            return ValueUInt8();
        case ConstantType::Int16:
            return ValueInt16();
        case ConstantType::UInt16:
            return ValueUInt16();
        case ConstantType::Int32:
            return ValueInt32();
        case ConstantType::UInt32:
            return ValueUInt32();
        case ConstantType::Int64:
            return ValueInt64();
        case ConstantType::UInt64:
            return ValueUInt64();
        case ConstantType::Float32:
            return ValueFloat32();
        case ConstantType::Float64:
            return ValueFloat64();
        case ConstantType::String:
            return ValueString();
        case ConstantType::Class:
            return ValueClass();
        default:
            impl::throw_invalid("Invalid constant type");
        }
    }